

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal_cost.c
# Opt level: O3

void BrotliEstimateBitCostsForLiterals(size_t pos,size_t len,size_t mask,uint8_t *data,float *cost)

{
  long *plVar1;
  byte bVar2;
  ulong uVar3;
  int iVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  size_t sVar8;
  long lVar9;
  ulong uVar10;
  byte bVar11;
  ulong *puVar12;
  long lVar13;
  bool bVar14;
  double dVar15;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  double dVar20;
  undefined8 uVar21;
  size_t in_window_utf8 [3];
  size_t histogram [3] [256];
  ulong local_1878 [4];
  ulong local_1858;
  float *local_1850;
  double local_1848;
  undefined8 uStack_1840;
  ulong local_1838 [769];
  
  local_1850 = cost;
  iVar4 = BrotliIsMostlyUTF8(data,pos,mask,len,0.75);
  if (iVar4 == 0) {
    memset(local_1838,0,0x800);
    sVar5 = 2000;
    if (len < 2000) {
      sVar5 = len;
    }
    uVar7 = pos;
    sVar8 = sVar5;
    if (len != 0) {
      do {
        local_1838[data[uVar7 & mask]] = local_1838[data[uVar7 & mask]] + 1;
        sVar8 = sVar8 - 1;
        uVar7 = uVar7 + 1;
      } while (sVar8 != 0);
      if (len != 0) {
        uVar7 = 2000;
        do {
          if (1999 < uVar7 - 2000) {
            local_1838[data[pos - 2000 & mask]] = local_1838[data[pos - 2000 & mask]] - 1;
            sVar5 = sVar5 - 1;
          }
          if (uVar7 < len) {
            local_1838[data[pos + 2000 & mask]] = local_1838[data[pos + 2000 & mask]] + 1;
            sVar5 = sVar5 + 1;
          }
          uVar10 = local_1838[data[pos & mask]];
          lVar9 = uVar10 + (uVar10 == 0);
          if (sVar5 < 0x100) {
            dVar20 = kLog2Table[sVar5];
            uVar21 = 0;
          }
          else {
            auVar18._8_4_ = (int)(sVar5 >> 0x20);
            auVar18._0_8_ = sVar5;
            auVar18._12_4_ = 0x45300000;
            dVar20 = log2((auVar18._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)sVar5) - 4503599627370496.0));
            uVar21 = extraout_XMM0_Qb_00;
          }
          if (uVar10 < 0x100) {
            dVar15 = kLog2Table[lVar9];
          }
          else {
            auVar19._8_4_ = (int)((ulong)lVar9 >> 0x20);
            auVar19._0_8_ = lVar9;
            auVar19._12_4_ = 0x45300000;
            local_1848 = dVar20;
            uStack_1840 = uVar21;
            dVar15 = log2((auVar19._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0));
            dVar20 = local_1848;
          }
          dVar20 = (dVar20 - dVar15) + 0.029;
          local_1850[uVar7 - 2000] =
               (float)(double)(-(ulong)(dVar20 < 1.0) & (ulong)(dVar20 * 0.5 + 0.5) |
                              ~-(ulong)(dVar20 < 1.0) & (ulong)dVar20);
          pos = pos + 1;
          sVar8 = uVar7 - 1999;
          uVar7 = uVar7 + 1;
        } while (sVar8 != len);
      }
    }
  }
  else {
    local_1838[0] = 0;
    local_1878[0] = 0;
    local_1858 = 0;
    if (len != 0) {
      sVar5 = 0;
      bVar11 = 0;
      do {
        bVar2 = data[sVar5 + pos & mask];
        puVar12 = local_1838;
        if ((((char)bVar2 < '\0') && (puVar12 = local_1878, bVar2 < 0xc0)) &&
           (puVar12 = local_1838, 0xdf < bVar11)) {
          puVar12 = &local_1858;
        }
        *puVar12 = *puVar12 + 1;
        sVar5 = sVar5 + 1;
        bVar11 = bVar2;
      } while (len != sVar5);
      uVar7 = (ulong)(0x18 < local_1878[0] + local_1858);
      memset(local_1838,0,0x1800);
      sVar5 = 0x1ef;
      if (len < 0x1ef) {
        sVar5 = len;
      }
      local_1878[0] = 0;
      local_1878[1] = 0;
      local_1878[2] = 0;
      uVar6 = 0;
      sVar8 = pos;
      uVar10 = 0;
      do {
        bVar11 = data[sVar8 & mask];
        local_1838[uVar6 * 0x100 + (ulong)bVar11] = local_1838[uVar6 * 0x100 + (ulong)bVar11] + 1;
        local_1878[uVar6] = local_1878[uVar6] + 1;
        if ((char)bVar11 < '\0') {
          uVar6 = uVar7;
          if ((bVar11 < 0xc0) && (uVar10 < 0xe0)) {
            uVar6 = 0;
          }
        }
        else {
          uVar6 = 0;
        }
        sVar8 = sVar8 + 1;
        sVar5 = sVar5 - 1;
        uVar10 = (ulong)bVar11;
      } while (sVar5 != 0);
      lVar9 = 2000;
      uVar10 = 0;
      do {
        if (0x1ee < uVar10) {
          if (uVar10 == 0x1ef) {
LAB_0013c47b:
            uVar6 = 0;
          }
          else {
            bVar14 = true;
            if (0x1f0 < uVar10) {
              bVar14 = data[(uVar10 - 0x1f1) + pos & mask] < 0xe0;
            }
            if (-1 < (char)data[(uVar10 - 0x1f0) + pos & mask]) goto LAB_0013c47b;
            uVar6 = uVar7;
            if (bVar14) {
              uVar6 = 0;
            }
            if (0xbf < data[(uVar10 - 0x1f0) + pos & mask]) {
              uVar6 = uVar7;
            }
          }
          plVar1 = (long *)((long)local_1838 +
                           (ulong)data[(uVar10 - 0x1ef) + pos & mask] * 8 +
                           (ulong)(uint)((int)uVar6 << 0xb));
          *plVar1 = *plVar1 + -1;
          local_1878[uVar6] = local_1878[uVar6] - 1;
        }
        if (uVar10 + 0x1ef < len) {
          if ((char)data[uVar10 + 0x1ee + pos & mask] < '\0') {
            uVar6 = uVar7;
            if ((data[uVar10 + 0x1ee + pos & mask] < 0xc0) &&
               (data[uVar10 + 0x1ed + pos & mask] < 0xe0)) {
              uVar6 = 0;
            }
          }
          else {
            uVar6 = 0;
          }
          plVar1 = (long *)((long)local_1838 +
                           (ulong)data[uVar10 + 0x1ef + pos & mask] * 8 +
                           (ulong)(uint)((int)uVar6 << 0xb));
          *plVar1 = *plVar1 + 1;
          local_1878[uVar6] = local_1878[uVar6] + 1;
        }
        if (uVar10 == 0) {
LAB_0013c557:
          uVar6 = 0;
        }
        else {
          bVar14 = true;
          if (uVar10 != 1) {
            bVar14 = data[(uVar10 - 2) + pos & mask] < 0xe0;
          }
          if (-1 < (char)data[(uVar10 - 1) + pos & mask]) goto LAB_0013c557;
          uVar6 = uVar7;
          if (bVar14) {
            uVar6 = 0;
          }
          if (0xbf < data[(uVar10 - 1) + pos & mask]) {
            uVar6 = uVar7;
          }
        }
        uVar3 = *(ulong *)((long)local_1838 +
                          (ulong)data[pos + uVar10 & mask] * 8 + (ulong)(uint)((int)uVar6 << 0xb));
        lVar13 = uVar3 + (uVar3 == 0);
        uVar6 = local_1878[uVar6];
        if (uVar6 < 0x100) {
          dVar20 = kLog2Table[uVar6];
          uVar21 = 0;
        }
        else {
          auVar16._8_4_ = (int)(uVar6 >> 0x20);
          auVar16._0_8_ = uVar6;
          auVar16._12_4_ = 0x45300000;
          dVar20 = log2((auVar16._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)uVar6) - 4503599627370496.0));
          uVar21 = extraout_XMM0_Qb;
        }
        if (uVar3 < 0x100) {
          dVar15 = kLog2Table[lVar13];
        }
        else {
          auVar17._8_4_ = (int)((ulong)lVar13 >> 0x20);
          auVar17._0_8_ = lVar13;
          auVar17._12_4_ = 0x45300000;
          local_1848 = dVar20;
          uStack_1840 = uVar21;
          dVar15 = log2((auVar17._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)lVar13) - 4503599627370496.0));
          dVar20 = local_1848;
        }
        dVar20 = (dVar20 - dVar15) + 0.02905;
        dVar20 = (double)(-(ulong)(dVar20 < 1.0) & (ulong)(dVar20 * 0.5 + 0.5) |
                         ~-(ulong)(dVar20 < 1.0) & (ulong)dVar20);
        if (uVar10 < 2000) {
          dVar20 = dVar20 + ((double)lVar9 / -2000.0) * 0.35 + 0.7;
        }
        local_1850[uVar10] = (float)dVar20;
        uVar10 = uVar10 + 1;
        lVar9 = lVar9 + -1;
      } while (len != uVar10);
    }
  }
  return;
}

Assistant:

void BrotliEstimateBitCostsForLiterals(size_t pos, size_t len, size_t mask,
                                       const uint8_t* data, float* cost) {
  if (BrotliIsMostlyUTF8(data, pos, mask, len, kMinUTF8Ratio)) {
    EstimateBitCostsForLiteralsUTF8(pos, len, mask, data, cost);
    return;
  } else {
    size_t histogram[256] = { 0 };
    size_t window_half = 2000;
    size_t in_window = BROTLI_MIN(size_t, window_half, len);

    /* Bootstrap histogram. */
    size_t i;
    for (i = 0; i < in_window; ++i) {
      ++histogram[data[(pos + i) & mask]];
    }

    /* Compute bit costs with sliding window. */
    for (i = 0; i < len; ++i) {
      size_t histo;
      if (i >= window_half) {
        /* Remove a byte in the past. */
        --histogram[data[(pos + i - window_half) & mask]];
        --in_window;
      }
      if (i + window_half < len) {
        /* Add a byte in the future. */
        ++histogram[data[(pos + i + window_half) & mask]];
        ++in_window;
      }
      histo = histogram[data[(pos + i) & mask]];
      if (histo == 0) {
        histo = 1;
      }
      {
        double lit_cost = FastLog2(in_window) - FastLog2(histo);
        lit_cost += 0.029;
        if (lit_cost < 1.0) {
          lit_cost *= 0.5;
          lit_cost += 0.5;
        }
        cost[i] = (float)lit_cost;
      }
    }
  }
}